

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O0

set<Map_*,_std::less<Map_*>,_std::allocator<Map_*>_> * __thiscall
Map::all_recursive_variants
          (set<Map_*,_std::less<Map_*>,_std::allocator<Map_*>_> *__return_storage_ptr__,Map *this)

{
  Map *pMVar1;
  bool bVar2;
  reference __in;
  reference ppMVar3;
  reference __in_00;
  type *ppMVar4;
  size_type sVar5;
  size_type sVar6;
  type *__1;
  type *variant_1;
  _Self local_d8;
  iterator __end3;
  iterator __begin3;
  map<Map_*,_Flag,_std::less<Map_*>,_std::allocator<std::pair<Map_*const,_Flag>_>_> *__range3;
  Map *map;
  iterator __end2;
  iterator __begin2;
  set<Map_*,_std::less<Map_*>,_std::allocator<Map_*>_> *__range2;
  type *_;
  type *variant;
  _Self local_68;
  const_iterator __end1;
  const_iterator __begin1;
  map<Map_*,_Flag,_std::less<Map_*>,_std::allocator<std::pair<Map_*const,_Flag>_>_> *__range1;
  undefined1 local_48 [8];
  set<Map_*,_std::less<Map_*>,_std::allocator<Map_*>_> previous_variants;
  Map *this_local;
  set<Map_*,_std::less<Map_*>,_std::allocator<Map_*>_> *current_variants;
  
  previous_variants._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  std::set<Map_*,_std::less<Map_*>,_std::allocator<Map_*>_>::set
            ((set<Map_*,_std::less<Map_*>,_std::allocator<Map_*>_> *)local_48);
  std::set<Map_*,_std::less<Map_*>,_std::allocator<Map_*>_>::set(__return_storage_ptr__);
  __end1 = std::map<Map_*,_Flag,_std::less<Map_*>,_std::allocator<std::pair<Map_*const,_Flag>_>_>::
           begin(&this->_variants);
  local_68._M_node =
       (_Base_ptr)
       std::map<Map_*,_Flag,_std::less<Map_*>,_std::allocator<std::pair<Map_*const,_Flag>_>_>::end
                 (&this->_variants);
  while (bVar2 = std::operator==(&__end1,&local_68), ((bVar2 ^ 0xffU) & 1) != 0) {
    __in = std::_Rb_tree_const_iterator<std::pair<Map_*const,_Flag>_>::operator*(&__end1);
    ppMVar4 = std::get<0ul,Map*const,Flag>(__in);
    std::get<1ul,Map*const,Flag>(__in);
    std::set<Map_*,_std::less<Map_*>,_std::allocator<Map_*>_>::insert
              (__return_storage_ptr__,ppMVar4);
    std::_Rb_tree_const_iterator<std::pair<Map_*const,_Flag>_>::operator++(&__end1);
  }
  do {
    std::set<Map_*,_std::less<Map_*>,_std::allocator<Map_*>_>::operator=
              ((set<Map_*,_std::less<Map_*>,_std::allocator<Map_*>_> *)local_48,
               __return_storage_ptr__);
    __end2 = std::set<Map_*,_std::less<Map_*>,_std::allocator<Map_*>_>::begin
                       ((set<Map_*,_std::less<Map_*>,_std::allocator<Map_*>_> *)local_48);
    map = (Map *)std::set<Map_*,_std::less<Map_*>,_std::allocator<Map_*>_>::end
                           ((set<Map_*,_std::less<Map_*>,_std::allocator<Map_*>_> *)local_48);
    while (bVar2 = std::operator==(&__end2,(_Self *)&map), ((bVar2 ^ 0xffU) & 1) != 0) {
      ppMVar3 = std::_Rb_tree_const_iterator<Map_*>::operator*(&__end2);
      pMVar1 = *ppMVar3;
      __end3 = std::
               map<Map_*,_Flag,_std::less<Map_*>,_std::allocator<std::pair<Map_*const,_Flag>_>_>::
               begin(&pMVar1->_variants);
      local_d8._M_node =
           (_Base_ptr)
           std::map<Map_*,_Flag,_std::less<Map_*>,_std::allocator<std::pair<Map_*const,_Flag>_>_>::
           end(&pMVar1->_variants);
      while (bVar2 = std::operator==(&__end3,&local_d8), ((bVar2 ^ 0xffU) & 1) != 0) {
        __in_00 = std::_Rb_tree_iterator<std::pair<Map_*const,_Flag>_>::operator*(&__end3);
        ppMVar4 = std::get<0ul,Map*const,Flag>(__in_00);
        std::get<1ul,Map*const,Flag>(__in_00);
        std::set<Map_*,_std::less<Map_*>,_std::allocator<Map_*>_>::insert
                  (__return_storage_ptr__,ppMVar4);
        std::_Rb_tree_iterator<std::pair<Map_*const,_Flag>_>::operator++(&__end3);
      }
      std::_Rb_tree_const_iterator<Map_*>::operator++(&__end2);
    }
    sVar5 = std::set<Map_*,_std::less<Map_*>,_std::allocator<Map_*>_>::size(__return_storage_ptr__);
    sVar6 = std::set<Map_*,_std::less<Map_*>,_std::allocator<Map_*>_>::size
                      ((set<Map_*,_std::less<Map_*>,_std::allocator<Map_*>_> *)local_48);
  } while (sVar6 < sVar5);
  std::set<Map_*,_std::less<Map_*>,_std::allocator<Map_*>_>::~set
            ((set<Map_*,_std::less<Map_*>,_std::allocator<Map_*>_> *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::set<Map*> Map::all_recursive_variants() const
{
    std::set<Map*> previous_variants;
    std::set<Map*> current_variants;
    for(auto& [variant, _] : _variants)
        current_variants.insert(variant);

    do {
        previous_variants = current_variants;
        for(Map* map : previous_variants)
        {
            for(auto& [variant, _] : map->_variants)
                current_variants.insert(variant);
        }
    } while(current_variants.size() > previous_variants.size());

    return current_variants;
}